

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

int __thiscall
TPZFBMatrix<std::complex<long_double>_>::Zero(TPZFBMatrix<std::complex<long_double>_> *this)

{
  complex<long_double> *pcVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (this->fElem).fNElements;
  if (lVar2 != 0) {
    lVar3 = 0x10;
    do {
      pcVar1 = (this->fElem).fStore;
      *(longdouble *)(pcVar1->_M_value + lVar3 + -0x10) = (longdouble)0;
      *(longdouble *)(pcVar1->_M_value + lVar3) = (longdouble)0;
      lVar3 = lVar3 + 0x20;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

inline int64_t size() const { return fNElements; }